

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall solitaire::graphics::Renderer::renderStockPile(Renderer *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  SelectedCardIndex local_30;
  SelectedCardIndex *local_28;
  optional<unsigned_int> *selectedCardIndex;
  Cards *pileCards;
  StockPile *pile;
  Renderer *this_local;
  
  pile = (StockPile *)this;
  iVar2 = (*this->context->_vptr_Context[5])();
  pileCards = (Cards *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x78))();
  selectedCardIndex =
       (optional<unsigned_int> *)
       (*(code *)(pileCards->
                 super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                 )._M_impl.super__Vector_impl_data._M_start[6])();
  local_30.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)
       (*(code *)(pileCards->
                 super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                 )._M_impl.super__Vector_impl_data._M_start[7])();
  local_28 = &local_30;
  bVar1 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::empty
                    ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                     selectedCardIndex);
  if (bVar1) {
    renderCardPlaceholder(this,&Layout::stockPilePosition);
  }
  else {
    renderStockPileWithCards(this,(Cards *)selectedCardIndex,local_28);
  }
  return;
}

Assistant:

void Renderer::renderStockPile() const {
    const auto& pile = context.getSolitaire().getStockPile();
    const auto& pileCards = pile.getCards();
    const auto& selectedCardIndex = pile.getSelectedCardIndex();

    if (pileCards.empty())
        renderCardPlaceholder(Layout::stockPilePosition);
    else renderStockPileWithCards(pileCards, selectedCardIndex);
}